

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::Row<1>::idct(int *pTemp,jpgd_block_t *pSrc)

{
  int iVar1;
  short *in_RSI;
  int *in_RDI;
  int dcval;
  
  iVar1 = left_shifti((int)*in_RSI,2);
  *in_RDI = iVar1;
  in_RDI[1] = iVar1;
  in_RDI[2] = iVar1;
  in_RDI[3] = iVar1;
  in_RDI[4] = iVar1;
  in_RDI[5] = iVar1;
  in_RDI[6] = iVar1;
  in_RDI[7] = iVar1;
  return;
}

Assistant:

static void idct(int* pTemp, const jpgd_block_t* pSrc)
		{
			const int dcval = left_shifti(pSrc[0], PASS1_BITS);

			pTemp[0] = dcval;
			pTemp[1] = dcval;
			pTemp[2] = dcval;
			pTemp[3] = dcval;
			pTemp[4] = dcval;
			pTemp[5] = dcval;
			pTemp[6] = dcval;
			pTemp[7] = dcval;
		}